

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::create_co_s(var *func,array *args)

{
  initializer_list<cs_impl::any> __l;
  bool bVar1;
  allocator_type *__a;
  callable *pcVar2;
  undefined8 uVar3;
  proxy *in_RDI;
  function *fptr_1;
  function_type *impl_f_1;
  object_method *om;
  function *fptr;
  function_type *impl_f;
  type_info *in_stack_fffffffffffffd38;
  type_info *in_stack_fffffffffffffd40;
  function *in_stack_fffffffffffffd48;
  fiber_callable *in_stack_fffffffffffffd50;
  function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_stack_fffffffffffffd58;
  allocator_type *in_stack_fffffffffffffd68;
  undefined8 **ppuVar4;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffd70;
  undefined8 **ppuVar5;
  undefined8 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  function<void_()> *in_stack_fffffffffffffda0;
  context_t *in_stack_fffffffffffffda8;
  allocator *paVar6;
  any *in_stack_fffffffffffffdc0;
  function *__last;
  array *in_stack_fffffffffffffdc8;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *__first;
  vector *in_stack_fffffffffffffdd0;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *this;
  function *in_stack_fffffffffffffdd8;
  fiber_callable *in_stack_fffffffffffffde0;
  undefined1 *local_1f0;
  undefined8 *local_1e8;
  undefined8 local_1e0;
  routine_t local_174;
  function *local_160;
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  function_type *local_130;
  object_method *local_128;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_118;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_f8 [4];
  routine_t local_74;
  function *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  function_type *local_20;
  
  any::type((any *)in_stack_fffffffffffffd40);
  bVar1 = std::type_info::operator==
                    ((type_info *)in_stack_fffffffffffffd50,(type_info *)in_stack_fffffffffffffd48);
  if (bVar1) {
    pcVar2 = any::const_val<cs::callable>(in_stack_fffffffffffffdc0);
    local_20 = cs::callable::get_raw_data(pcVar2);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    target_type(in_stack_fffffffffffffd58);
    bVar1 = std::type_info::operator!=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    if (bVar1) {
      local_55 = 1;
      uVar3 = __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_40,"Only can create coroutine from covscript function.",&local_41);
      cs::lang_error::lang_error
                ((lang_error *)in_stack_fffffffffffffd40,(string *)in_stack_fffffffffffffd38);
      local_55 = 0;
      __cxa_throw(uVar3,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    local_60 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs::function>(in_stack_fffffffffffffd58);
    __a = (allocator_type *)cs::function::get_context(local_60);
    __first = local_f8;
    __last = local_60;
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffd38);
    this = &local_118;
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffd38);
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x43d4be);
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
              (this,__first,
               (_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *)__last,
               __a);
    fiber_callable::fiber_callable
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               (vector *)in_stack_fffffffffffffd40);
    std::function<void()>::function<cs_impl::runtime_cs_ext::fiber_callable,void>
              ((function<void_()> *)in_stack_fffffffffffffd50,
               (fiber_callable *)in_stack_fffffffffffffd48);
    local_74 = fiber::create(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::make_shared<cs_impl::runtime_cs_ext::fiber_holder_impl,unsigned_int>
              ((uint *)in_stack_fffffffffffffd68);
    any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>
              ((any *)in_stack_fffffffffffffd50,
               (shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)in_stack_fffffffffffffd48);
    std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>::~shared_ptr
              ((shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)0x43d57c);
    std::function<void_()>::~function((function<void_()> *)0x43d589);
    fiber_callable::~fiber_callable((fiber_callable *)0x43d596);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffd50);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x43d5b0);
  }
  else {
    any::type((any *)in_stack_fffffffffffffd40);
    bVar1 = std::type_info::operator==
                      ((type_info *)in_stack_fffffffffffffd50,(type_info *)in_stack_fffffffffffffd48
                      );
    if (bVar1) {
      local_128 = any::const_val<cs::object_method>(in_stack_fffffffffffffdc0);
      pcVar2 = any::const_val<cs::callable>(in_stack_fffffffffffffdc0);
      local_130 = cs::callable::get_raw_data(pcVar2);
      std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
      target_type(in_stack_fffffffffffffd58);
      bVar1 = std::type_info::operator!=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      if (bVar1) {
        local_152 = 1;
        uVar3 = __cxa_allocate_exception(0x20);
        paVar6 = &local_151;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_150,"Only can create coroutine from covscript function.",paVar6);
        cs::lang_error::lang_error
                  ((lang_error *)in_stack_fffffffffffffd40,(string *)in_stack_fffffffffffffd38);
        local_152 = 0;
        __cxa_throw(uVar3,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
      }
      local_160 = std::
                  function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                  ::target<cs::function>(in_stack_fffffffffffffd58);
      cs::function::get_context(local_160);
      any::any((any *)in_stack_fffffffffffffd40,(any *)in_stack_fffffffffffffd38);
      local_1e8 = &local_1f0;
      local_1e0 = 1;
      std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x43d845);
      __l._M_len._0_4_ = in_stack_fffffffffffffd80;
      __l._M_array = (iterator)in_stack_fffffffffffffd78;
      __l._M_len._4_4_ = in_stack_fffffffffffffd84;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                (in_stack_fffffffffffffd70,__l,in_stack_fffffffffffffd68);
      fiber_callable::fiber_callable
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 in_stack_fffffffffffffdc8);
      std::function<void()>::function<cs_impl::runtime_cs_ext::fiber_callable,void>
                ((function<void_()> *)in_stack_fffffffffffffd50,
                 (fiber_callable *)in_stack_fffffffffffffd48);
      local_174 = fiber::create(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      std::make_shared<cs_impl::runtime_cs_ext::fiber_holder_impl,unsigned_int>
                ((uint *)in_stack_fffffffffffffd68);
      any::any<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>
                ((any *)in_stack_fffffffffffffd50,
                 (shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)in_stack_fffffffffffffd48
                );
      std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>::~shared_ptr
                ((shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *)0x43d902);
      std::function<void_()>::~function((function<void_()> *)0x43d90f);
      fiber_callable::~fiber_callable((fiber_callable *)0x43d91c);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffd50);
      std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x43d936);
      ppuVar5 = (undefined8 **)&local_1f0;
      ppuVar4 = &local_1e8;
      do {
        ppuVar4 = ppuVar4 + -1;
        any::~any((any *)0x43d95f);
      } while (ppuVar4 != ppuVar5);
    }
    else {
      any::any<cs::pointer>((any *)in_stack_fffffffffffffd50,(pointer *)in_stack_fffffffffffffd48);
    }
  }
  return (var)in_RDI;
}

Assistant:

var create_co_s(const var &func, const array &args)
		{
			if (func.type() == typeid(callable)) {
				const cs::callable::function_type &impl_f = func.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, vector(args.begin(), args.end()))));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				const cs::callable::function_type &impl_f = om.callable.const_val<callable>().get_raw_data();
				if (impl_f.target_type() != typeid(function))
					throw lang_error("Only can create coroutine from covscript function.");
				function const *fptr = impl_f.target<function>();
				return std::make_shared<fiber_holder_impl>(fiber::create(fptr->get_context(), fiber_callable(fptr, {om.object}, args)));
			}
			return null_pointer;
		}